

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall
myEmployeeCustomConstructor::ArchiveOUT(myEmployeeCustomConstructor *this,ChArchiveOut *marchive)

{
  ChArchiveOut *this_00;
  ChNameValue<int> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  myEmployeeCustomConstructor *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  chrono::ChArchiveOut::VersionWrite<myEmployeeCustomConstructor>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,local_18);
  this_00 = local_18;
  chrono::make_ChNameValue<int>(&local_30,"legs",&this->legs,'\0');
  chrono::ChArchiveOut::operator<<(this_00,&local_30);
  chrono::ChNameValue<int>::~ChNameValue(&local_30);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeCustomConstructor>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);
        // stream out member data (except data used in constructor, already saved in ArchiveOUTconstructor)
        marchive << CHNVP(legs);
    }